

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O3

ROMInfo * MT32Emu::ROMInfo::getROMInfo(File *file,ROMInfo **romInfos)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  ROMInfo *romInfo;
  ROMInfo *pRVar4;
  
  iVar1 = (*file->_vptr_File[2])();
  pRVar4 = *romInfos;
  if (pRVar4 != (ROMInfo *)0x0) {
    uVar3 = 1;
    do {
      if (CONCAT44(extraout_var,iVar1) == pRVar4->fileSize) {
        iVar2 = (*file->_vptr_File[4])(file);
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),*pRVar4->sha1Digest);
        if (iVar2 == 0) {
          return pRVar4;
        }
      }
      pRVar4 = romInfos[uVar3];
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (pRVar4 != (ROMInfo *)0x0);
  }
  return (ROMInfo *)0x0;
}

Assistant:

const ROMInfo *ROMInfo::getROMInfo(File *file, const ROMInfo * const *romInfos) {
	size_t fileSize = file->getSize();
	for (Bit32u i = 0; romInfos[i] != NULL; i++) {
		const ROMInfo *romInfo = romInfos[i];
		if (fileSize == romInfo->fileSize && !strcmp(file->getSHA1(), romInfo->sha1Digest)) {
			return romInfo;
		}
	}
	return NULL;
}